

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::ActiveTipChange
          (PeerManagerImpl *this,CBlockIndex *new_tip,bool is_ibd)

{
  CRollingBloomFilter *pCVar1;
  undefined3 in_register_00000011;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock39;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (CONCAT31(in_register_00000011,is_ibd) == 0) {
    local_20._M_device = &(this->m_tx_download_mutex).super_mutex;
    local_20._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_20);
    pCVar1 = RecentRejectsFilter(this);
    CRollingBloomFilter::reset(pCVar1);
    pCVar1 = RecentRejectsReconsiderableFilter(this);
    CRollingBloomFilter::reset(pCVar1);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ActiveTipChange(const CBlockIndex& new_tip, bool is_ibd)
{
    // Ensure mempool mutex was released, otherwise deadlock may occur if another thread holding
    // m_tx_download_mutex waits on the mempool mutex.
    AssertLockNotHeld(m_mempool.cs);
    AssertLockNotHeld(m_tx_download_mutex);

    if (!is_ibd) {
        LOCK(m_tx_download_mutex);
        // If the chain tip has changed, previously rejected transactions might now be valid, e.g. due
        // to a timelock. Reset the rejection filters to give those transactions another chance if we
        // see them again.
        RecentRejectsFilter().reset();
        RecentRejectsReconsiderableFilter().reset();
    }
}